

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::router::
register_handler<false,dummy1(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,dummy1)>
          (router *this,string *name,
          _func_dummy1_weak_ptr<rest_rpc::rpc_service::connection>_dummy1 *f,bool pub)

{
  bool bVar1;
  invalid_argument *this_00;
  byte in_CL;
  uint *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar2;
  uint32_t key;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_28;
  uint32_t local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  std::__cxx11::string::data();
  local_20 = MD5::MD5Hash32((char *)in_stack_ffffffffffffffa0);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_ffffffffffffff98,(key_type *)0x204cae);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (!bVar1) {
    pVar2 = std::
            unordered_map<unsigned_int,std::__cxx11::string,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
            ::emplace<unsigned_int&,std::__cxx11::string_const&>
                      (in_stack_ffffffffffffffb0,in_RDI,in_stack_ffffffffffffffa0);
    register_nonmember_func<false,dummy1(*)(std::weak_ptr<rest_rpc::rpc_service::connection>,dummy1)>
              ((router *)
               pVar2.first.
               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               ,(uint32_t)((ulong)in_RDI >> 0x20),
               (_func_dummy1_weak_ptr<rest_rpc::rpc_service::connection>_dummy1 *)
               in_stack_ffffffffffffffa0);
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"duplicate registration key !");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void register_handler(std::string const &name, Function f, bool pub = false) {
    uint32_t key = MD5::MD5Hash32(name.data());
    if (key2func_name_.find(key) != key2func_name_.end()) {
      throw std::invalid_argument("duplicate registration key !");
    } else {
      key2func_name_.emplace(key, name);
      return register_nonmember_func<is_pub>(key, std::move(f));
    }
  }